

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O1

void __thiscall
r_exec::Group::_initiate_sln_propagation
          (Group *this,Code *object,double change,double source_sln_thr)

{
  Code *pCVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  uint16_t i;
  ushort uVar5;
  double extraout_XMM0_Qa;
  ulong in_XMM0_Qb;
  vector<r_code::Code_*,_std::allocator<r_code::Code_*>_> path;
  Code *local_70;
  vector<r_code::Code_*,_std::allocator<r_code::Code_*>_> local_68;
  double local_50;
  double local_48;
  double local_38;
  ulong uStack_30;
  
  local_38 = ABS(change);
  uStack_30 = in_XMM0_Qb & 0x7fffffffffffffff;
  local_70 = object;
  local_50 = source_sln_thr;
  local_48 = change;
  (*(object->super__Object)._vptr__Object[0x15])(object);
  if (extraout_XMM0_Qa < local_38) {
    local_68.super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<r_code::Code*,std::allocator<r_code::Code*>>::_M_realloc_insert<r_code::Code*const&>
              ((vector<r_code::Code*,std::allocator<r_code::Code*>> *)&local_68,(iterator)0x0,
               &local_70);
    (*(local_70->super__Object)._vptr__Object[4])(local_70,0);
    cVar2 = r_code::Atom::getDescriptor();
    if (cVar2 == -0x3c) {
      for (uVar5 = 0; iVar3 = (*(local_70->super__Object)._vptr__Object[10])(),
          uVar5 < (ushort)iVar3; uVar5 = uVar5 + 1) {
        iVar3 = (*(local_70->super__Object)._vptr__Object[9])(local_70,(ulong)uVar5);
        _propagate_sln(this,(Code *)CONCAT44(extraout_var,iVar3),local_48,local_50,&local_68);
      }
    }
    (*(local_70->super__Object)._vptr__Object[0x13])();
    pCVar1 = local_70;
    lVar4 = (local_70->markers).used_cells_head;
    if (lVar4 != -1) {
      do {
        _propagate_sln(this,(pCVar1->markers).cells.
                            super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar4].data,local_48,local_50,
                       &local_68);
        lVar4 = (pCVar1->markers).cells.
                super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar4].next;
      } while (lVar4 != -1);
    }
    (*(local_70->super__Object)._vptr__Object[0x14])();
    if (local_68.super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void Group::_initiate_sln_propagation(Code *object, double change, double source_sln_thr) const
{
    if (fabs(change) > object->get_psln_thr()) {
        std::vector<Code *> path;
        path.push_back(object);

        if (object->code(0).getDescriptor() == Atom::MARKER) { // if marker, propagate to references.
            for (uint16_t i = 0; i < object->references_size(); ++i) {
                _propagate_sln(object->get_reference(i), change, source_sln_thr, path);
            }
        }

        // propagate to markers
        object->acq_markers();
        r_code::list<Code *>::const_iterator m;

        for (m = object->markers.begin(); m != object->markers.end(); ++m) {
            _propagate_sln(*m, change, source_sln_thr, path);
        }

        object->rel_markers();
    }
}